

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O2

Aig_Man_t * Aig_ManSplit(Aig_Man_t *p,int nVars,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Man_t *pAVar4;
  DdManager *dd;
  Aig_Man_t *vSubset;
  void *pvVar5;
  Vec_Ptr_t *vCofs;
  abctime aVar6;
  DdNode *n;
  int i;
  int iVar7;
  char *__s;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  DdNode *local_48;
  abctime local_40;
  Aig_Man_t *local_38;
  
  iVar7 = nVars;
  local_40 = Abc_Clock();
  if (p->nTruePos == 1) {
    if (nVars < 1) {
      __s = "The number of cofactoring variables should be a positive number.";
    }
    else {
      if ((uint)nVars < 0x11) {
        pAVar3 = Aig_ManCo(p,iVar7);
        pAVar4 = (Aig_Man_t *)
                 Aig_Support(p,(Aig_Obj_t *)((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe));
        if (*(int *)((long)&pAVar4->pName + 4) == 0) {
          puts("Property output function is a constant.");
          Vec_PtrFree((Vec_Ptr_t *)pAVar4);
          return (Aig_Man_t *)0x0;
        }
        dd = Aig_ManBuildPoBdd(p,&local_48);
        if (fVerbose != 0) {
          uVar1 = *(int *)((long)&pAVar4->pName + 4);
          uVar2 = Cudd_DagSize(local_48);
          printf("Support =%5d.  BDD size =%6d.  ",(ulong)uVar1,(ulong)uVar2);
        }
        local_38 = pAVar4;
        vSubset = (Aig_Man_t *)Aig_ManVecRandSubset((Vec_Ptr_t *)pAVar4,nVars);
        uVar1 = *(int *)((long)&vSubset->pName + 4);
        uVar9 = 0;
        uVar10 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar10 = 0;
        }
        for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          pAVar4 = vSubset;
          pvVar5 = Vec_PtrEntry((Vec_Ptr_t *)vSubset,(int)uVar9);
          *(void **)((long)vSubset->pSpec + uVar9 * 8) = *(void **)((long)pvVar5 + 0x28);
        }
        vCofs = Aig_ManCofactorBdds(pAVar4,(Vec_Ptr_t *)vSubset,dd,local_48);
        pAVar4 = Aig_ManConvertBddsToAigs(p,dd,vCofs);
        Vec_PtrFree((Vec_Ptr_t *)local_38);
        Vec_PtrFree((Vec_Ptr_t *)vSubset);
        if (fVerbose != 0) {
          iVar7 = 0x7e6f94;
          printf("Created %d cofactors (out of %d).  ",(ulong)(uint)pAVar4->nTruePos,
                 (ulong)(uint)vCofs->nSize);
          aVar6 = Abc_Clock();
          lVar8 = aVar6 - local_40;
          Abc_Print(iVar7,"%s =","Time");
          Abc_Print(iVar7,"%9.2f sec\n",(double)lVar8 / 1000000.0);
        }
        Cudd_RecursiveDeref(dd,local_48);
        i = 0;
        iVar7 = vCofs->nSize;
        if (vCofs->nSize < 1) {
          iVar7 = i;
        }
        for (; iVar7 != i; i = i + 1) {
          n = (DdNode *)Vec_PtrEntry(vCofs,i);
          Cudd_RecursiveDeref(dd,n);
        }
        Vec_PtrFree(vCofs);
        Extra_StopManager(dd);
        return pAVar4;
      }
      __s = "The number of cofactoring variables should be less than 17.";
    }
  }
  else {
    __s = "Currently works only for one primary output.";
  }
  puts(__s);
  return (Aig_Man_t *)0x0;
}

Assistant:

Aig_Man_t * Aig_ManSplit( Aig_Man_t * p, int nVars, int fVerbose )
{
    Aig_Man_t * pRes;
    Aig_Obj_t * pNode;
    DdNode * bFunc;
    DdManager * dd;
    Vec_Ptr_t * vSupp, * vSubs, * vCofs;
    int i;
    abctime clk = Abc_Clock();
    if ( Saig_ManPoNum(p) != 1 )
    {
        printf( "Currently works only for one primary output.\n" );
        return NULL;
    }
    if ( nVars < 1 )
    {
        printf( "The number of cofactoring variables should be a positive number.\n" );
        return NULL;
    }
    if ( nVars > 16 )
    {
        printf( "The number of cofactoring variables should be less than 17.\n" );
        return NULL;
    }
    vSupp = Aig_Support( p, Aig_ObjFanin0(Aig_ManCo(p,0)) );
    if ( Vec_PtrSize(vSupp) == 0 )
    {
        printf( "Property output function is a constant.\n" );
        Vec_PtrFree( vSupp );
        return NULL;
    }
    dd    = Aig_ManBuildPoBdd( p, &bFunc ); // bFunc is referenced
    if ( fVerbose )
        printf( "Support =%5d.  BDD size =%6d.  ", Vec_PtrSize(vSupp), Cudd_DagSize(bFunc) );
    vSubs = Aig_ManVecRandSubset( vSupp, nVars );
    // replace nodes by their BDD variables
    Vec_PtrForEachEntry( Aig_Obj_t *, vSubs, pNode, i )
        Vec_PtrWriteEntry( vSubs, i, pNode->pData );
    // derive cofactors and functions
    vCofs = Aig_ManCofactorBdds( p, vSubs, dd, bFunc );
    pRes  = Aig_ManConvertBddsToAigs( p, dd, vCofs );
    Vec_PtrFree( vSupp );
    Vec_PtrFree( vSubs );
    if ( fVerbose )
        printf( "Created %d cofactors (out of %d).  ", Saig_ManPoNum(pRes), Vec_PtrSize(vCofs) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // dereference
    Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrForEachEntry( DdNode *, vCofs, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vCofs );
    Extra_StopManager( dd );
    return pRes;
}